

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O2

void do_cmd_birth_init(command *cmd)

{
  short sVar1;
  player *p;
  char *__s;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  player_race *r;
  player_class *c;
  int *piVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 local_60;
  char local_58 [40];
  
  p = player;
  character_dungeon = false;
  sVar1 = player->ht_birth;
  if (sVar1 == 0) {
    r = player_id2race(0);
    c = player_id2class(0);
    player_generate(p,r,c,false);
  }
  else {
    pcVar8 = player->full_name;
    __s = find_roman_suffix_start(pcVar8);
    if (__s != (char *)0x0) {
      builtin_strncpy(local_58,"MDCLXVI",8);
      iVar11 = -1;
      if (*__s != '\0') {
        local_60 = strlen(__s);
        iVar9 = 0;
        uVar12 = 0;
        while ((iVar11 = iVar9, uVar12 < local_60 &&
               (pcVar2 = strchr(local_58,(int)__s[uVar12]), iVar11 = -1, pcVar2 != (char *)0x0))) {
          uVar13 = uVar12 + 1;
          uVar10 = (ulong)((int)pcVar2 - (int)local_58);
          if (((0x54UL >> (uVar10 & 0x3f) & 1) == 0) || (__s[uVar13] == '\0')) {
            lVar4 = 0;
          }
          else {
            pcVar2 = *(char **)(&DAT_002ce7d0 + uVar10 * 8);
            pcVar3 = strchr(pcVar2,(int)__s[uVar13]);
            if (pcVar3 == (char *)0x0) {
              lVar4 = 0;
            }
            else {
              lVar4 = (long)(((int)pcVar3 - (int)pcVar2) + 1);
              uVar13 = uVar12 + 2;
            }
          }
          iVar9 = iVar9 + *(int *)(&DAT_0025c0c0 + lVar4 * 4 + uVar10 * 0xc);
          uVar12 = uVar13;
        }
      }
      local_58[0x10] = 'C';
      local_58[0x11] = '\0';
      local_58[0x12] = 'L';
      local_58[0x13] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = 'X';
      local_58[0x16] = 'L';
      local_58[0x17] = '\0';
      local_58[0x18] = 'X';
      local_58[0x19] = '\0';
      local_58[0x1a] = '\0';
      local_58[0x1b] = 'I';
      local_58[0x1c] = 'X';
      local_58[0x1d] = '\0';
      local_58[0x1e] = 'V';
      local_58[0] = 'M';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = 'C';
      local_58[4] = 'M';
      local_58[5] = '\0';
      local_58[6] = 'D';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = 'C';
      local_58[10] = 'D';
      local_58[0xb] = '\0';
      local_58[0xc] = 'C';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = 'X';
      local_58[0x1f] = 0;
      local_58[0x20] = '\0';
      local_58[0x21] = 'I';
      local_58[0x22] = 'V';
      local_58[0x23] = '\0';
      local_58[0x24] = 'I';
      local_58[0x25] = '\0';
      local_58[0x26] = '\0';
      *__s = '\0';
      if (iVar11 < 0) {
LAB_0019744b:
        msg("Sorry, could not deal with suffix");
      }
      else {
        pcVar8 = pcVar8 + (0x20 - (long)__s);
        iVar11 = iVar11 + 1;
        while (0 < iVar11) {
          pcVar2 = (char *)((long)&local_60 + 5);
          piVar5 = &DAT_0025c080;
          do {
            pcVar2 = pcVar2 + 3;
            iVar9 = *piVar5;
            piVar5 = piVar5 + 1;
          } while (iVar11 < iVar9);
          sVar6 = strlen(__s);
          sVar7 = strlen(pcVar2);
          if (pcVar8 < (undefined1 *)(sVar7 + sVar6 + 1)) {
            *__s = '\0';
            goto LAB_0019744b;
          }
          my_strcat(__s,pcVar2,(size_t)pcVar8);
          iVar11 = iVar11 - iVar9;
        }
      }
    }
    save_roller_data(&quickstart_prev);
  }
  quickstart_allowed = sVar1 != 0;
  event_signal_flag(EVENT_ENTER_BIRTH,(_Bool)quickstart_allowed);
  return;
}

Assistant:

void do_cmd_birth_init(struct command *cmd)
{
	char *buf;

	/* The dungeon is not ready */
	character_dungeon = false;

	/*
	 * If there's a quickstart character, store it for later use.
	 * If not, default to whatever the first of the choices is.
	 */
	if (player->ht_birth) {
		/* Handle incrementing name suffix */
		buf = find_roman_suffix_start(player->full_name);
		if (buf) {
			/* Try to increment the roman suffix */
			int success = int_to_roman(
				roman_to_int(buf) + 1,
				buf,
				sizeof(player->full_name) - (buf - (char *)&player->full_name));

			if (!success) {
				msg("Sorry, could not deal with suffix");
			}
		}

		save_roller_data(&quickstart_prev);
		quickstart_allowed = true;
	} else {
		player_generate(player, player_id2race(0), player_id2class(0), false);
		quickstart_allowed = false;
	}

	/* We're ready to start the birth process */
	event_signal_flag(EVENT_ENTER_BIRTH, quickstart_allowed);
}